

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessBuffersTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::DirectStateAccess::Buffers::ErrorsTest::TestErrorsOfNamedBufferData(ErrorsTest *this)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  deUint32 dVar7;
  RenderContext *pRVar8;
  undefined4 extraout_var;
  uint *puVar10;
  TestContext *pTVar11;
  TestLog *pTVar12;
  MessageBuilder *pMVar13;
  reference pvVar14;
  Enum<int,_2UL> EVar15;
  value_type local_3cc;
  GetNameFunc p_Stack_3c8;
  GLuint tmp_buffer_1;
  int local_3c0;
  Enum<int,_2UL> local_3b8;
  MessageBuilder local_3a8;
  MessageBuilder local_228;
  value_type local_a8;
  uint local_a4;
  GLuint tmp_buffer;
  GLuint i_1;
  GLenum error;
  GLsizei i;
  GLsizeiptr max_possible_size;
  GLsizei max_pointer_unsigned_bits;
  GLenum invalid_usage;
  GLuint not_a_buffer_name;
  undefined1 local_78 [8];
  stack<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_> too_much_buffers;
  GLubyte dummy_data [4];
  GLuint immutable_buffer;
  GLuint buffer;
  bool internal_error;
  bool is_ok;
  Functions *gl;
  ErrorsTest *this_local;
  long lVar9;
  
  pRVar8 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar6 = (*pRVar8->_vptr_RenderContext[3])();
  lVar9 = CONCAT44(extraout_var,iVar6);
  dummy_data[0] = '\0';
  dummy_data[1] = '\0';
  dummy_data[2] = '\0';
  dummy_data[3] = '\0';
  too_much_buffers.c.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Deque_impl_data._M_finish._M_node._4_4_ = 0;
  too_much_buffers.c.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Deque_impl_data._M_finish._M_node._0_4_ = 0;
  std::stack<unsigned_int,std::deque<unsigned_int,std::allocator<unsigned_int>>>::
  stack<std::deque<unsigned_int,std::allocator<unsigned_int>>,void>
            ((stack<unsigned_int,std::deque<unsigned_int,std::allocator<unsigned_int>>> *)local_78);
  (**(code **)(lVar9 + 0x3b8))(1,dummy_data);
  dVar7 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar7,"glCreateBuffers failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                  ,0x1159);
  (**(code **)(lVar9 + 0x3b8))
            (1,(undefined1 *)
               ((long)&too_much_buffers.c.
                       super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Deque_impl_data._M_finish._M_node + 4));
  dVar7 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar7,"glCreateBuffers failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                  ,0x115c);
  (*this->m_pNamedBufferStorage)
            (too_much_buffers.c.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Deque_impl_data._M_finish._M_node._4_4_,4,
             &too_much_buffers.c.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_node,1);
  dVar7 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar7,"glNamedBuffeStorage failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                  ,0x115f);
  max_pointer_unsigned_bits = 0;
  do {
    max_pointer_unsigned_bits = max_pointer_unsigned_bits + 1;
    cVar1 = (**(code **)(lVar9 + 0xc68))();
  } while (cVar1 != '\0');
  (*this->m_pNamedBufferData)
            (max_pointer_unsigned_bits,4,
             &too_much_buffers.c.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_node,0x88ea);
  bVar2 = ErrorCheckAndLog(this,"glNamedBufferData",0x502,
                           " if buffer is not the name of an existing buffer object.");
  max_possible_size._4_4_ = 0;
  do {
    max_possible_size._4_4_ = max_possible_size._4_4_ + 1;
    puVar10 = std::find<unsigned_int_const*,unsigned_int>
                        (TestErrorsOfNamedBufferData::valid_usages,
                         TestErrorsOfNamedBufferData::valid_usages + 9,
                         (uint *)((long)&max_possible_size + 4));
  } while (puVar10 != TestErrorsOfNamedBufferData::valid_usages + 9);
  (*this->m_pNamedBufferData)
            ((GLuint)dummy_data,4,
             &too_much_buffers.c.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_node,max_possible_size._4_4_);
  bVar3 = ErrorCheckAndLog(this,"glNamedBufferData",0x500,
                           " if usage is not STREAM_DRAW, STREAM_READ, STREAM_COPY, STATIC_DRAW, STATIC_READ, STATIC_COPY, DYNAMIC_DRAW, DYNAMIC_READ or DYNAMIC_COPY."
                          );
  (*this->m_pNamedBufferData)
            ((GLuint)dummy_data,-1,
             &too_much_buffers.c.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_node,0x88ea);
  bVar4 = ErrorCheckAndLog(this,"glNamedBufferData",0x501," if size is negative.");
  (*this->m_pNamedBufferData)
            (too_much_buffers.c.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Deque_impl_data._M_finish._M_node._4_4_,2,
             &too_much_buffers.c.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_node,0x88ea);
  bVar5 = ErrorCheckAndLog(this,"glNamedBufferData",0x502,
                           " if the BUFFER_IMMUTABLE_STORAGE flag of the buffer object is TRUE.");
  immutable_buffer._3_1_ = (bVar4 && (bVar3 && bVar2)) && bVar5;
  max_possible_size._0_4_ = 0x3f;
  _error = 0;
  for (i_1 = 0; (int)i_1 < 0x3f; i_1 = i_1 + 1) {
    _error = 1L << ((byte)i_1 & 0x3f) | _error;
  }
  tmp_buffer = 0;
  for (local_a4 = 0; local_a4 < 0x100; local_a4 = local_a4 + 1) {
    local_a8 = 0;
    (**(code **)(lVar9 + 0x3b8))(1,&local_a8);
    dVar7 = (**(code **)(lVar9 + 0x800))();
    glu::checkError(dVar7,"glCreateBuffers failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                    ,0x11ad);
    std::stack<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>::push
              ((stack<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_> *)
               local_78,&local_a8);
    (*this->m_pNamedBufferData)(local_a8,_error,(GLvoid *)0x0,0x88ea);
    tmp_buffer = (**(code **)(lVar9 + 0x800))();
    if (tmp_buffer != 0) break;
  }
  if (tmp_buffer == 0) {
    pTVar11 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    pTVar12 = tcu::TestContext::getLog(pTVar11);
    tcu::TestLog::operator<<(&local_228,pTVar12,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar13 = tcu::MessageBuilder::operator<<
                        (&local_228,
                         (char (*) [270])
                         "Test of NamedBufferData out of memory negative behavior failed to generate erroneous situation. Direct State Access Buffers Test\'s MAX_NUMBER_OF_TRIES_TO_GENERATE_OUT_OF_MEMORY_ERROR is too small or the driver implementation does not inform about out of memory problem."
                        );
    tcu::MessageBuilder::operator<<(pMVar13,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_228);
  }
  else {
    bVar2 = tmp_buffer != 0x505;
    if (bVar2) {
      pTVar11 = deqp::Context::getTestContext((this->super_TestCase).m_context);
      pTVar12 = tcu::TestContext::getLog(pTVar11);
      tcu::TestLog::operator<<(&local_3a8,pTVar12,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar13 = tcu::MessageBuilder::operator<<
                          (&local_3a8,
                           (char (*) [122])
                           "NamedBufferData does not generate OUT_OF_MEMORY error if the GL is unable to create a data store with the specified size."
                          );
      pMVar13 = tcu::MessageBuilder::operator<<(pMVar13,(char (*) [20])"The error value of ");
      EVar15 = glu::getErrorStr(tmp_buffer);
      p_Stack_3c8 = EVar15.m_getName;
      local_3c0 = EVar15.m_value;
      local_3b8.m_getName = p_Stack_3c8;
      local_3b8.m_value = local_3c0;
      pMVar13 = tcu::MessageBuilder::operator<<(pMVar13,&local_3b8);
      pMVar13 = tcu::MessageBuilder::operator<<(pMVar13,(char (*) [15])" was observed.");
      tcu::MessageBuilder::operator<<(pMVar13,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_3a8);
    }
    immutable_buffer._3_1_ = !bVar2 && immutable_buffer._3_1_;
  }
  if (dummy_data != (GLubyte  [4])0x0) {
    (**(code **)(lVar9 + 0x438))(1,dummy_data);
    dummy_data[0] = '\0';
    dummy_data[1] = '\0';
    dummy_data[2] = '\0';
    dummy_data[3] = '\0';
  }
  while (bVar2 = std::stack<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>
                 ::empty((stack<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>
                          *)local_78), ((bVar2 ^ 0xffU) & 1) != 0) {
    pvVar14 = std::stack<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>::
              top((stack<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                  local_78);
    local_3cc = *pvVar14;
    if (local_3cc != 0) {
      (**(code **)(lVar9 + 0x438))(1,&local_3cc);
    }
    std::stack<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>::pop
              ((stack<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_> *)
               local_78);
  }
  if (too_much_buffers.c.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Deque_impl_data._M_finish._M_node._4_4_ != 0) {
    (**(code **)(lVar9 + 0x438))
              (1,(undefined1 *)
                 ((long)&too_much_buffers.c.
                         super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Deque_impl_data._M_finish._M_node + 4));
    too_much_buffers.c.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Deque_impl_data._M_finish._M_node._4_4_ = 0;
  }
  std::stack<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>::~stack
            ((stack<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_> *)
             local_78);
  return immutable_buffer._3_1_;
}

Assistant:

bool ErrorsTest::TestErrorsOfNamedBufferData()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Return value. */
	bool is_ok			= true;
	bool internal_error = false;

	/* Common variables. */
	glw::GLuint				buffer			 = 0;
	glw::GLuint				immutable_buffer = 0;
	glw::GLubyte			dummy_data[4]	= {};
	std::stack<glw::GLuint> too_much_buffers;

	try
	{
		/* Common preparations. */
		gl.createBuffers(1, &buffer);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateBuffers failed.");

		gl.createBuffers(1, &immutable_buffer);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateBuffers failed.");

		m_pNamedBufferStorage(immutable_buffer, sizeof(dummy_data), &dummy_data, GL_MAP_READ_BIT);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glNamedBuffeStorage failed.");

		/* Test invalid buffer name error behavior. */
		{
			/* Prepare for invalid buffer name error behavior verification. */
			glw::GLuint not_a_buffer_name = 0;

			while (gl.isBuffer(++not_a_buffer_name))
				;

			/* Test. */
			m_pNamedBufferData(not_a_buffer_name, sizeof(dummy_data), dummy_data, GL_DYNAMIC_COPY);

			is_ok &= ErrorCheckAndLog("glNamedBufferData", GL_INVALID_OPERATION,
									  " if buffer is not the name of an existing buffer object.");
		}

		/* Test invalid usage error behavior. */
		{
			/* Prepare for invalid type error behavior verification. */
			static const glw::GLenum valid_usages[] = { GL_STREAM_DRAW,  GL_STREAM_READ,  GL_STREAM_COPY,
														GL_STATIC_DRAW,  GL_STATIC_READ,  GL_STATIC_COPY,
														GL_DYNAMIC_DRAW, GL_DYNAMIC_READ, GL_DYNAMIC_COPY,
														GL_NONE };
			static const glw::GLenum valid_usages_last = sizeof(valid_usages) / sizeof(valid_usages[0]) - 1;

			glw::GLenum invalid_usage = 0;

			while (&valid_usages[valid_usages_last] !=
				   std::find(&valid_usages[0], &valid_usages[valid_usages_last], (++invalid_usage)))
				;

			/* Test. */
			m_pNamedBufferData(buffer, sizeof(dummy_data), dummy_data, invalid_usage);

			is_ok &=
				ErrorCheckAndLog("glNamedBufferData", GL_INVALID_ENUM,
								 " if usage is not STREAM_DRAW, STREAM_READ, STREAM_COPY, STATIC_DRAW, STATIC_READ,"
								 " STATIC_COPY, DYNAMIC_DRAW, DYNAMIC_READ or DYNAMIC_COPY.");
		}

		/* Test negative size error behavior. */
		{
			m_pNamedBufferData(buffer, -1, dummy_data, GL_DYNAMIC_COPY);

			is_ok &= ErrorCheckAndLog("glNamedBufferData", GL_INVALID_VALUE, " if size is negative.");
		}

		/* Test immutable buffer error behavior. */
		{
			m_pNamedBufferData(immutable_buffer, sizeof(dummy_data) / 2, dummy_data, GL_DYNAMIC_COPY);

			is_ok &= ErrorCheckAndLog("glNamedBufferData", GL_INVALID_OPERATION,
									  " if the BUFFER_IMMUTABLE_STORAGE flag of the buffer object is TRUE.");
		}

		/* Test out of memory error behavior. */
		{
			/* Calculate maximum buffer size (depending on number of bits of function argument). */
			glw::GLsizei max_pointer_unsigned_bits =
				(CHAR_BIT * sizeof(glw::GLsizeiptr) - 1) /* do not include possible sign bit */;
			glw::GLsizeiptr max_possible_size = 0;

			for (glw::GLsizei i = 0; i < max_pointer_unsigned_bits; ++i)
			{
				max_possible_size |= ((glw::GLsizeiptr)1 << i);
			}

			/* Error storing variable. */
			glw::GLenum error = GL_NO_ERROR;

			/* Try to overflow by allocating biggest possible buffers in a loop. */
			for (glw::GLuint i = 0; i < MAX_NUMBER_OF_TRIES_TO_GENERATE_OUT_OF_MEMORY_ERROR; ++i)
			{
				/* New big buffer creation. */
				glw::GLuint tmp_buffer = 0;

				gl.createBuffers(1, &tmp_buffer);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateBuffers failed.");

				/* Add it to delete list. */
				too_much_buffers.push(tmp_buffer);

				/* Try to allocate big buffer storage. */
				m_pNamedBufferData(tmp_buffer, max_possible_size, DE_NULL, GL_DYNAMIC_COPY);

				/* Check for errors. */
				error = gl.getError();

				if (error != GL_NO_ERROR)
				{
					break;
				}
			}

			if (error == GL_NO_ERROR)
			{
				/* Log. */
				m_context.getTestContext().getLog()
					<< tcu::TestLog::Message << "Test of NamedBufferData out of memory negative behavior failed to "
												"generate erroneous situation. "
												"Direct State Access Buffers Test's "
												"MAX_NUMBER_OF_TRIES_TO_GENERATE_OUT_OF_MEMORY_ERROR is too small or "
												"the driver implementation does not inform about out of memory problem."
					<< tcu::TestLog::EndMessage;
			}
			else
			{
				if (error != GL_OUT_OF_MEMORY)
				{
					/* Log. */
					m_context.getTestContext().getLog()
						<< tcu::TestLog::Message << "NamedBufferData does not generate OUT_OF_MEMORY error if the GL "
													"is unable to create a data store with the specified size."
						<< "The error value of " << glu::getErrorStr(error) << " was observed."
						<< tcu::TestLog::EndMessage;

					is_ok = false;
				}
			}
		}
	}
	catch (...)
	{
		is_ok		   = false;
		internal_error = true;
	}

	if (buffer)
	{
		gl.deleteBuffers(1, &buffer);

		buffer = 0;
	}

	while (!too_much_buffers.empty())
	{
		glw::GLuint tmp_buffer = too_much_buffers.top();

		if (tmp_buffer)
		{
			gl.deleteBuffers(1, &tmp_buffer);
		}

		too_much_buffers.pop();
	}

	if (immutable_buffer)
	{
		gl.deleteBuffers(1, &immutable_buffer);

		immutable_buffer = 0;
	}

	if (internal_error)
	{
		throw 0;
	}

	return is_ok;
}